

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.hpp
# Opt level: O1

void __thiscall ClipperLib::PolyTree::~PolyTree(PolyTree *this)

{
  ~PolyTree(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

~PolyTree(){ Clear(); }